

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::declare_undefined_values(CompilerGLSL *this)

{
  size_t sVar1;
  Variant *pVVar2;
  bool bVar3;
  SPIRUndef *pSVar4;
  SPIRType *type;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  TypedID<(spirv_cross::Types)0> *pTVar7;
  string initializer;
  LoopLock LStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar1 = (this->super_Compiler).ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar1 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_98);
  }
  else {
    pTVar6 = (this->super_Compiler).ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar7 = pTVar6 + sVar1;
    bVar3 = false;
    do {
      while( true ) {
        uVar5 = (ulong)pTVar6->id;
        pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar5 * 3);
        if (pVVar2[uVar5].type == TypeUndef) break;
LAB_001bd648:
        pTVar6 = pTVar6 + 1;
        if (pTVar6 == pTVar7) {
          ParsedIR::LoopLock::~LoopLock(&LStack_98);
          if (!bVar3) {
            return;
          }
          goto LAB_001bd79d;
        }
      }
      pSVar4 = Variant::get<spirv_cross::SPIRUndef>(pVVar2 + uVar5);
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(pSVar4->super_IVariant).field_0xc);
      if (*(int *)&(type->super_IVariant).field_0xc == 1) goto LAB_001bd648;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      if (((this->options).force_zero_initialized_variables == true) &&
         (bVar3 = type_can_zero_initialize(this,type), bVar3)) {
        (*(this->super_Compiler)._vptr_Compiler[0x33])
                  ((char (*) [4])local_90,this,(ulong)*(uint *)&(pSVar4->super_IVariant).field_0xc);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_50,(spirv_cross *)0x2f38c7,(char (*) [4])local_90,ts_1);
        ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0]);
        }
      }
      (*(this->super_Compiler)._vptr_Compiler[6])
                (local_90,this,(ulong)(pSVar4->super_IVariant).self.id,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1a])
                (&local_50,this,type,local_90,(ulong)(pSVar4->super_IVariant).self.id);
      statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_50,&local_70,(char (*) [2])0x2d9bde);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pTVar6 = pTVar6 + 1;
      bVar3 = true;
    } while (pTVar6 != pTVar7);
    ParsedIR::LoopLock::~LoopLock(&LStack_98);
LAB_001bd79d:
    statement<char_const(&)[1]>(this,(char (*) [1])0x2d80a2);
  }
  return;
}

Assistant:

void CompilerGLSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, const SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

		statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
		emitted = true;
	});

	if (emitted)
		statement("");
}